

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

int __thiscall
btSoftBody::rayTest(btSoftBody *this,btVector3 *rayFrom,btVector3 *rayTo,btScalar *mint,_ *feature,
                   int *index,bool bcountonly)

{
  bool bVar1;
  int iVar2;
  Face *pFVar3;
  btScalar *in_RCX;
  long in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  btScalar bVar4;
  btVector3 bVar5;
  undefined1 in_stack_00000008;
  ICollide *in_stack_00000018;
  btVector3 *in_stack_00000020;
  btVector3 *in_stack_00000028;
  btScalar t_1;
  btVector3 v2;
  btVector3 v1;
  btVector3 v0;
  int index2;
  int index1;
  int index0;
  int f_1;
  int tetfaces [4] [3];
  Tetra *tet;
  int i_1;
  RayFromToCaster collider;
  btScalar t;
  Face *f;
  int ni;
  int i;
  btVector3 dir;
  int cnt;
  btVector3 *in_stack_fffffffffffffea8;
  btVector3 *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffed8;
  btVector3 *in_stack_fffffffffffffee0;
  btVector3 *in_stack_fffffffffffffee8;
  RayFromToCaster *in_stack_fffffffffffffef0;
  int local_fc;
  undefined1 local_f8 [48];
  Tetra *local_c8;
  btScalar local_c0;
  btScalar local_78;
  long local_70;
  btScalar local_5c;
  Face *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  btScalar in_stack_ffffffffffffffb4;
  int iVar6;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar7;
  
  bVar4 = (btScalar)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar7 = CONCAT13(in_stack_00000008,in_stack_ffffffffffffffcc) & 0x1ffffff;
  iVar6 = 0;
  bVar5 = operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (((uVar7 & 0x1000000) != 0) || (bVar1 = btDbvt::empty((btDbvt *)(in_RDI + 0x518)), bVar1)) {
    in_stack_ffffffffffffffb4 = 0.0;
    in_stack_ffffffffffffffb0 =
         btAlignedObjectArray<btSoftBody::Face>::size
                   ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0));
    for (; (int)in_stack_ffffffffffffffb4 < in_stack_ffffffffffffffb0;
        in_stack_ffffffffffffffb4 = (btScalar)((int)in_stack_ffffffffffffffb4 + 1)) {
      in_stack_ffffffffffffffa8 =
           btAlignedObjectArray<btSoftBody::Face>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),
                      (int)in_stack_ffffffffffffffb4);
      local_5c = RayFromToCaster::rayFromToTriangle
                           (in_R8,in_R9,(btVector3 *)CONCAT44(uVar7,iVar6),bVar5.m_floats._8_8_,
                            bVar5.m_floats._0_8_,
                            (btVector3 *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (btScalar)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if ((0.0 < local_5c) && (iVar6 = iVar6 + 1, (uVar7 & 0x1000000) == 0)) {
        in_R8->m_floats[0] = 4.2039e-45;
        in_R9->m_floats[0] = in_stack_ffffffffffffffb4;
        *in_RCX = local_5c;
      }
    }
  }
  else {
    RayFromToCaster::RayFromToCaster
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,bVar4);
    btDbvt::rayTest((btDbvtNode *)v2.m_floats._0_8_,in_stack_00000028,in_stack_00000020,
                    in_stack_00000018);
    if (local_70 != 0) {
      *in_RCX = local_78;
      in_R8->m_floats[0] = 4.2039e-45;
      pFVar3 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),0);
      in_R9->m_floats[0] = (btScalar)((local_70 - (long)pFVar3) / 0x48);
      iVar6 = 1;
    }
    RayFromToCaster::~RayFromToCaster((RayFromToCaster *)0x276134);
  }
  for (local_c0 = 0.0; bVar4 = local_c0,
      iVar2 = btAlignedObjectArray<btSoftBody::Tetra>::size
                        ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0)),
      (int)bVar4 < iVar2; local_c0 = (btScalar)((int)local_c0 + 1)) {
    local_c8 = btAlignedObjectArray<btSoftBody::Tetra>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Tetra> *)(in_RDI + 0x3d0),(int)local_c0)
    ;
    memcpy(local_f8,&DAT_0029db30,0x30);
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      bVar4 = RayFromToCaster::rayFromToTriangle
                        (in_R8,in_R9,(btVector3 *)CONCAT44(uVar7,iVar6),bVar5.m_floats._8_8_,
                         bVar5.m_floats._0_8_,
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (btScalar)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if ((0.0 < bVar4) && (iVar6 = iVar6 + 1, (uVar7 & 0x1000000) == 0)) {
        in_R8->m_floats[0] = 5.60519e-45;
        in_R9->m_floats[0] = local_c0;
        *in_RCX = bVar4;
      }
    }
  }
  return iVar6;
}

Assistant:

int					btSoftBody::rayTest(const btVector3& rayFrom,const btVector3& rayTo,
										btScalar& mint,eFeature::_& feature,int& index,bool bcountonly) const
{
	int	cnt=0;
	btVector3 dir = rayTo-rayFrom;
	

	if(bcountonly||m_fdbvt.empty())
	{/* Full search	*/ 
		
		for(int i=0,ni=m_faces.size();i<ni;++i)
		{
			const btSoftBody::Face&	f=m_faces[i];

			const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
				f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x,
				mint);
			if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Face;
					index=i;
					mint=t;
				}
			}
		}
	}
	else
	{/* Use dbvt	*/ 
		RayFromToCaster	collider(rayFrom,rayTo,mint);

		btDbvt::rayTest(m_fdbvt.m_root,rayFrom,rayTo,collider);
		if(collider.m_face)
		{
			mint=collider.m_mint;
			feature=btSoftBody::eFeature::Face;
			index=(int)(collider.m_face-&m_faces[0]);
			cnt=1;
		}
	}

	for (int i=0;i<m_tetras.size();i++)
	{
		const btSoftBody::Tetra& tet = m_tetras[i];
		int tetfaces[4][3] = {{0,1,2},{0,1,3},{1,2,3},{0,2,3}};
		for (int f=0;f<4;f++)
		{

			int index0=tetfaces[f][0];
			int index1=tetfaces[f][1];
			int index2=tetfaces[f][2];
			btVector3 v0=tet.m_n[index0]->m_x;
			btVector3 v1=tet.m_n[index1]->m_x;
			btVector3 v2=tet.m_n[index2]->m_x;


		const btScalar			t=RayFromToCaster::rayFromToTriangle(	rayFrom,rayTo,dir,
			v0,v1,v2,
				mint);
		if(t>0)
			{
				++cnt;
				if(!bcountonly)
				{
					feature=btSoftBody::eFeature::Tetra;
					index=i;
					mint=t;
				}
			}
		}
	}
	return(cnt);
}